

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O3

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::populateDefaultShadersAndRules(GLEngine *this)

{
  pointer pSVar1;
  undefined1 *puVar2;
  GLEngine *pGVar3;
  long lVar4;
  __hashtable *__h_21;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>_>_>
  *puVar5;
  initializer_list<polyscope::render::ShaderStageSpecification> __l;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_00;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_01;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_02;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_03;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_04;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_05;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_06;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_07;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_08;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_09;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_10;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_11;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_12;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_13;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_14;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_15;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_16;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_17;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_18;
  initializer_list<polyscope::render::ShaderStageSpecification> __l_19;
  __hashtable *__h;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  vStack_248;
  undefined1 auStack_230 [16];
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_220;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_218;
  pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>
  local_200;
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [24];
  undefined1 local_1a8 [24];
  _Alloc_hider local_190;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  local_188;
  undefined1 local_170 [24];
  undefined1 local_158 [32];
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_138;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined4 local_100;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  local_f8;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  local_e0;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  local_c8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  local_90;
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  *local_50;
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  *local_48;
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  *local_40;
  GLEngine *local_38;
  
  local_1e0._0_4_ = FLEX_MESH_VERT_SHADER;
  auStack_230._0_8_ = 0x2083c6;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0378);
  auStack_230._0_8_ = 0x2083d7;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0390);
  auStack_230._0_8_ = 0x2083eb;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c03a8);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20840f;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c03c0,DAT_004c03c8 + DAT_004c03c0);
  local_170._0_4_ = FLEX_MESH_FRAG_SHADER;
  auStack_230._0_8_ = 0x208430;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c03e8);
  auStack_230._0_8_ = 0x208444;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0400);
  auStack_230._0_8_ = 0x208458;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0418);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20847c;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c0430,DAT_004c0438 + DAT_004c0430);
  auStack_230._0_8_ = 0x208498;
  __l._M_len = 2;
  __l._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x2084a7;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x2084c7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[5],_true>(&local_90,(char (*) [5])"MESH",&local_200);
  local_220 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&this->registeredShaderPrograms;
  auStack_230._0_8_ = 0x2084e0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x2084f0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208506;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x208510;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20851a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x208532;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20853c;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208546;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x208550;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_SPHERE_VERT_SHADER;
  auStack_230._0_8_ = 0x208575;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0b98);
  auStack_230._0_8_ = 0x208586;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0bb0);
  auStack_230._0_8_ = 0x20859a;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0bc8);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x2085bd;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c0be0,DAT_004c0be8 + DAT_004c0be0);
  local_170._0_4_ = FLEX_SPHERE_GEOM_SHADER;
  auStack_230._0_8_ = 0x2085ee;
  local_38 = this;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0c08);
  auStack_230._0_8_ = 0x208602;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0c20);
  auStack_230._0_8_ = 0x208616;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0c38);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x208639;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c0c50,DAT_004c0c58 + DAT_004c0c50);
  local_100 = FLEX_SPHERE_FRAG_SHADER;
  auStack_230._0_8_ = 0x208662;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0c78);
  auStack_230._0_8_ = 0x208676;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0c90);
  auStack_230._0_8_ = 0x20868a;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0ca8);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x2086ae;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c0cc0,DAT_004c0cc8 + DAT_004c0cc0);
  auStack_230._0_8_ = 0x2086ca;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_00,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x2086d9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Points;
  auStack_230._0_8_ = 0x2086f9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"RAYCAST_SPHERE",&local_200);
  auStack_230._0_8_ = 0x20870b;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20871b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208731;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20873b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x208745;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20875d;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x208767;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208771;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20877b;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_VECTOR_VERT_SHADER;
  auStack_230._0_8_ = 0x2087a0;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0910);
  auStack_230._0_8_ = 0x2087b1;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0928);
  auStack_230._0_8_ = 0x2087c5;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0940);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x2087e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c0958,DAT_004c0960 + DAT_004c0958);
  local_170._0_4_ = FLEX_VECTOR_GEOM_SHADER;
  auStack_230._0_8_ = 0x208811;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0980);
  auStack_230._0_8_ = 0x208825;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0998);
  auStack_230._0_8_ = 0x208839;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c09b0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20885c;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c09c8,DAT_004c09d0 + DAT_004c09c8);
  local_100 = FLEX_VECTOR_FRAG_SHADER;
  auStack_230._0_8_ = 0x208885;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c09f0);
  auStack_230._0_8_ = 0x208899;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0a08);
  auStack_230._0_8_ = 0x2088ad;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0a20);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x2088d0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c0a38,DAT_004c0a40 + DAT_004c0a38);
  auStack_230._0_8_ = 0x2088ec;
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_01,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x2088fb;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Points;
  auStack_230._0_8_ = 0x20891b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"RAYCAST_VECTOR",&local_200);
  auStack_230._0_8_ = 0x20892d;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20893d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208953;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20895d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x208967;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20897f;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x208989;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208993;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20899d;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = FLEX_CYLINDER_VERT_SHADER;
  auStack_230._0_8_ = 0x2089c2;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c11a8);
  auStack_230._0_8_ = 0x2089d3;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c11c0);
  auStack_230._0_8_ = 0x2089e7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c11d8);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x208a0a;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c11f0,DAT_004c11f8 + DAT_004c11f0);
  local_170._0_4_ = FLEX_CYLINDER_GEOM_SHADER;
  auStack_230._0_8_ = 0x208a33;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c1218);
  auStack_230._0_8_ = 0x208a47;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c1230);
  auStack_230._0_8_ = 0x208a5b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c1248);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x208a7e;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c1260,DAT_004c1268 + DAT_004c1260);
  local_100 = FLEX_CYLINDER_FRAG_SHADER;
  auStack_230._0_8_ = 0x208aa7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c1288);
  auStack_230._0_8_ = 0x208abb;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c12a0);
  auStack_230._0_8_ = 0x208acf;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c12b8);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x208af2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c12d0,DAT_004c12d8 + DAT_004c12d0);
  auStack_230._0_8_ = 0x208b0b;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_02,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x208b1a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Points;
  auStack_230._0_8_ = 0x208b3a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[17],_true>(&local_90,(char (*) [17])"RAYCAST_CYLINDER",&local_200);
  auStack_230._0_8_ = 0x208b4c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x208b5c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208b72;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x208b7c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x208b86;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x208b9e;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x208ba8;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208bb2;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x208bbc;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = HISTOGRAM_VERT_SHADER;
  auStack_230._0_8_ = 0x208be0;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c01e0);
  auStack_230._0_8_ = 0x208bf1;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c01f8);
  auStack_230._0_8_ = 0x208c05;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0210);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x208c28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c0228,DAT_004c0230 + DAT_004c0228);
  local_170._0_4_ = HISTOGRAM_FRAG_SHADER;
  auStack_230._0_8_ = 0x208c49;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0250);
  auStack_230._0_8_ = 0x208c5d;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0268);
  auStack_230._0_8_ = 0x208c71;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0280);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x208c94;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c0298,DAT_004c02a0 + DAT_004c0298);
  auStack_230._0_8_ = 0x208cad;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_03,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x208cbc;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x208cdc;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>(&local_90,(char (*) [10])"HISTOGRAM",&local_200);
  auStack_230._0_8_ = 0x208cee;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x208cfe;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208d14;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x208d1e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x208d28;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x208d40;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x208d4a;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208d54;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x208d5e;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  local_48 = (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
              *)&DAT_004bfc70;
  auStack_230._0_8_ = 0x208d8a;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bfc70);
  local_50 = (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
              *)&DAT_004bfc88;
  auStack_230._0_8_ = 0x208da3;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bfc88);
  auStack_230._0_8_ = 0x208dba;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfca0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x208ddd;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bfcb8,DAT_004bfcc0 + DAT_004bfcb8);
  local_170._0_4_ = GROUND_PLANE_TILE_FRAG_SHADER;
  auStack_230._0_8_ = 0x208e00;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bfce0);
  auStack_230._0_8_ = 0x208e15;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bfcf8);
  auStack_230._0_8_ = 0x208e2a;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfd10);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x208e4f;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bfd28,DAT_004bfd30 + DAT_004bfd28);
  auStack_230._0_8_ = 0x208e68;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_04,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x208e77;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x208e97;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"GROUND_PLANE_TILE",&local_200);
  auStack_230._0_8_ = 0x208ea9;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x208eb9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x208ecf;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x208ed9;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x208ee3;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x208efb;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x208f05;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x208f0f;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x208f19;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x208f3a;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x208f4f;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x208f62;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfca0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x208f85;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bfcb8,DAT_004bfcc0 + DAT_004bfcb8);
  local_170._0_4_ = GROUND_PLANE_TILE_REFLECT_FRAG_SHADER;
  auStack_230._0_8_ = 0x208fa8;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bfd50);
  auStack_230._0_8_ = 0x208fbd;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bfd68);
  auStack_230._0_8_ = 0x208fd2;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfd80);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x208ff7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bfd98,DAT_004bfda0 + DAT_004bfd98);
  auStack_230._0_8_ = 0x209010;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_05,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20901f;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20903f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[26],_true>(&local_90,(char (*) [26])"GROUND_PLANE_TILE_REFLECT",&local_200);
  auStack_230._0_8_ = 0x209051;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209061;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x209077;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209081;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20908b;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x2090a3;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x2090ad;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x2090b7;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x2090c1;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = GROUND_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x2090e2;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x2090f7;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20910a;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfca0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20912d;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bfcb8,DAT_004bfcc0 + DAT_004bfcb8);
  local_170._0_4_ = GROUND_PLANE_SHADOW_FRAG_SHADER;
  auStack_230._0_8_ = 0x209151;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bfdc0);
  auStack_230._0_8_ = 0x209166;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bfdd8);
  auStack_230._0_8_ = 0x20917b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bfdf0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x2091a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bfe08,DAT_004bfe10 + DAT_004bfe08);
  auStack_230._0_8_ = 0x2091b9;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_06,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x2091c8;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x2091e8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[20],_true>(&local_90,(char (*) [20])"GROUND_PLANE_SHADOW",&local_200);
  auStack_230._0_8_ = 0x2091fa;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20920a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x209220;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20922a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x209234;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20924c;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209256;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x209260;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20926a;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  local_48 = (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
              *)&DAT_004bf1c0;
  auStack_230._0_8_ = 0x209299;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf1c0);
  local_50 = (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
              *)&DAT_004bf1d8;
  auStack_230._0_8_ = 0x2092b3;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf1d8);
  local_40 = (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
              *)&DAT_004bf1f0;
  auStack_230._0_8_ = 0x2092d0;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf1f0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x2092f5;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = MAP_LIGHT_FRAG_SHADER;
  auStack_230._0_8_ = 0x209319;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf748);
  auStack_230._0_8_ = 0x20932e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf760);
  auStack_230._0_8_ = 0x209343;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf778);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209368;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf790,DAT_004bf798 + DAT_004bf790);
  auStack_230._0_8_ = 0x209384;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_07,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209393;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x2093b3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[10],_true>(&local_90,(char (*) [10])"MAP_LIGHT",&local_200);
  auStack_230._0_8_ = 0x2093c5;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x2093d5;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x2093eb;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x2093f5;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x2093ff;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x209417;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209421;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20942b;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x209435;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = RIBBON_VERT_SHADER;
  auStack_230._0_8_ = 0x20945c;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0fa0);
  auStack_230._0_8_ = 0x20946e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0fb8);
  auStack_230._0_8_ = 0x209483;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0fd0);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x2094a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c0fe8,DAT_004c0ff0 + DAT_004c0fe8);
  local_170._0_4_ = RIBBON_GEOM_SHADER;
  auStack_230._0_8_ = 0x2094d2;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c1010);
  auStack_230._0_8_ = 0x2094e6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c1028);
  auStack_230._0_8_ = 0x2094fa;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c1040);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20951d;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c1058,DAT_004c1060 + DAT_004c1058);
  local_100 = RIBBON_FRAG_SHADER;
  auStack_230._0_8_ = 0x209547;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector(&local_f8,
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c1080);
  auStack_230._0_8_ = 0x20955b;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector(&local_e0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c1098);
  auStack_230._0_8_ = 0x20956f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_c8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c10b0);
  local_b0[0] = local_a0;
  auStack_230._0_8_ = 0x209592;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,DAT_004c10c8,DAT_004c10d0 + DAT_004c10c8);
  auStack_230._0_8_ = 0x2095ab;
  __l_08._M_len = 3;
  __l_08._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_08,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x2095ba;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  pGVar3 = local_38;
  local_200.second = IndexedLineStripAdjacency;
  auStack_230._0_8_ = 0x2095e2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[7],_true>(&local_90,(char (*) [7])"RIBBON",&local_200);
  auStack_230._0_8_ = 0x2095f4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209604;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20961a;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209624;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20962e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0x150;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x209646;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209650;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20965a;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x209664;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = SLICE_PLANE_VERT_SHADER;
  auStack_230._0_8_ = 0x20968b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c0048);
  auStack_230._0_8_ = 0x20969d;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c0060);
  auStack_230._0_8_ = 0x2096b2;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c0078);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x2096d7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004c0090,DAT_004c0098 + DAT_004c0090);
  local_170._0_4_ = SLICE_PLANE_FRAG_SHADER;
  auStack_230._0_8_ = 0x2096fb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004c00b8);
  auStack_230._0_8_ = 0x209710;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004c00d0);
  auStack_230._0_8_ = 0x209725;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004c00e8);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20974a;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004c0100,DAT_004c0108 + DAT_004c0100);
  auStack_230._0_8_ = 0x209763;
  __l_09._M_len = 2;
  __l_09._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_09,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209779;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x209799;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[12],_true>(&local_90,(char (*) [12])"SLICE_PLANE",&local_200);
  auStack_230._0_8_ = 0x2097ab;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x2097bb;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x2097d1;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x2097db;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x2097e5;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x2097fd;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209807;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x209811;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20981b;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20983e;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x209853;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20986b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x209890;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = PLAIN_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x2098b4;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf2a0);
  auStack_230._0_8_ = 0x2098c9;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf2b8);
  auStack_230._0_8_ = 0x2098de;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf2d0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209903;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf2e8,DAT_004bf2f0 + DAT_004bf2e8);
  auStack_230._0_8_ = 0x20991c;
  __l_10._M_len = 2;
  __l_10._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_10,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209932;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x209952;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[19],_true>(&local_90,(char (*) [19])"TEXTURE_DRAW_PLAIN",&local_200);
  auStack_230._0_8_ = 0x209964;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209974;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20998a;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209994;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20999e;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x2099b6;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x2099c0;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x2099ca;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x2099d4;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x2099f7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x209a0c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x209a24;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x209a49;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = DOT3_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x209a6d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf310);
  auStack_230._0_8_ = 0x209a82;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf328);
  auStack_230._0_8_ = 0x209a97;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf340);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209abc;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf358,DAT_004bf360 + DAT_004bf358);
  auStack_230._0_8_ = 0x209ad5;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_11,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209aeb;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x209b0b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"TEXTURE_DRAW_DOT3",&local_200);
  auStack_230._0_8_ = 0x209b1d;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209b2d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x209b43;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209b4d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x209b57;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x209b6f;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209b79;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x209b83;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x209b8d;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x209bb0;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x209bc5;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x209bdd;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x209c02;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = MAP3_TEXTURE_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x209c26;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf380);
  auStack_230._0_8_ = 0x209c3b;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf398);
  auStack_230._0_8_ = 0x209c50;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf3b0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209c75;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf3c8,DAT_004bf3d0 + DAT_004bf3c8);
  auStack_230._0_8_ = 0x209c8e;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_12,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209c9d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x209cbd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[18],_true>(&local_90,(char (*) [18])"TEXTURE_DRAW_MAP3",&local_200);
  auStack_230._0_8_ = 0x209ccf;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209cdf;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x209cf5;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209cff;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x209d09;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x209d21;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209d2b;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x209d35;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x209d3f;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = SPHEREBG_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x209d66;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf230);
  auStack_230._0_8_ = 0x209d78;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf248);
  auStack_230._0_8_ = 0x209d8d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf260);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x209db2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf278,DAT_004bf280 + DAT_004bf278);
  local_170._0_4_ = SPHEREBG_DRAW_FRAG_SHADER;
  auStack_230._0_8_ = 0x209dd6;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf3f0);
  auStack_230._0_8_ = 0x209deb;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf408);
  auStack_230._0_8_ = 0x209e00;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf420);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209e25;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf438,DAT_004bf440 + DAT_004bf438);
  auStack_230._0_8_ = 0x209e3e;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_13,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x209e54;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x209e74;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[22],_true>(&local_90,(char (*) [22])"TEXTURE_DRAW_SPHEREBG",&local_200);
  auStack_230._0_8_ = 0x209e86;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x209e96;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x209eac;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x209eb6;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x209ec0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x209ed8;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x209ee2;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x209eec;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x209ef6;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x209f19;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x209f2e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x209f46;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x209f6b;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = COMPOSITE_PEEL;
  auStack_230._0_8_ = 0x209f8f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf460);
  auStack_230._0_8_ = 0x209fa4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf478);
  auStack_230._0_8_ = 0x209fb9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf490);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x209fde;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf4a8,DAT_004bf4b0 + DAT_004bf4a8);
  auStack_230._0_8_ = 0x209ff7;
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_14,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a00d;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a02d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[15],_true>(&local_90,(char (*) [15])"COMPOSITE_PEEL",&local_200);
  auStack_230._0_8_ = 0x20a03f;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a04f;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a065;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a06f;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a079;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a091;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a09b;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a0a5;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a0af;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20a0d2;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x20a0e7;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20a0ff;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20a124;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = DEPTH_COPY;
  auStack_230._0_8_ = 0x20a148;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf4d0);
  auStack_230._0_8_ = 0x20a15d;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf4e8);
  auStack_230._0_8_ = 0x20a172;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf500);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20a197;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf518,DAT_004bf520 + DAT_004bf518);
  auStack_230._0_8_ = 0x20a1b0;
  __l_15._M_len = 2;
  __l_15._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_15,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a1c6;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a1e6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[11],_true>(&local_90,(char (*) [11])"DEPTH_COPY",&local_200);
  auStack_230._0_8_ = 0x20a1f8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a208;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a21e;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a228;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a232;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a24a;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a254;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a25e;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a268;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20a28b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x20a2a0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20a2b8;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20a2dd;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = DEPTH_TO_MASK;
  auStack_230._0_8_ = 0x20a301;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf540);
  auStack_230._0_8_ = 0x20a316;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf558);
  auStack_230._0_8_ = 0x20a32b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf570);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20a350;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf588,DAT_004bf590 + DAT_004bf588);
  auStack_230._0_8_ = 0x20a369;
  __l_16._M_len = 2;
  __l_16._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_16,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a37f;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a39f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[14],_true>(&local_90,(char (*) [14])"DEPTH_TO_MASK",&local_200);
  auStack_230._0_8_ = 0x20a3b1;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a3c1;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a3d7;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a3e1;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a3eb;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a403;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a40d;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a417;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a421;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20a444;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x20a459;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20a471;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20a496;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = SCALAR_TEXTURE_COLORMAP;
  auStack_230._0_8_ = 0x20a4ba;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf5b0);
  auStack_230._0_8_ = 0x20a4cf;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf5c8);
  auStack_230._0_8_ = 0x20a4e4;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf5e0);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20a509;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf5f8,DAT_004bf600 + DAT_004bf5f8);
  auStack_230._0_8_ = 0x20a522;
  __l_17._M_len = 2;
  __l_17._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_17,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a538;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a558;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[24],_true>(&local_90,(char (*) [24])"SCALAR_TEXTURE_COLORMAP",&local_200);
  auStack_230._0_8_ = 0x20a56a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a57a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a590;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a59a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a5a4;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a5bc;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a5c6;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a5d0;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a5da;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TEXTURE_DRAW_VERT_SHADER;
  auStack_230._0_8_ = 0x20a5fd;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),local_48);
  auStack_230._0_8_ = 0x20a612;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,local_50);
  auStack_230._0_8_ = 0x20a62a;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,local_40);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20a64f;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bf208,DAT_004bf210 + DAT_004bf208);
  local_170._0_4_ = BLUR_RGB;
  auStack_230._0_8_ = 0x20a673;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bf620);
  auStack_230._0_8_ = 0x20a688;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bf638);
  auStack_230._0_8_ = 0x20a69d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bf650);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20a6c2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bf668,DAT_004bf670 + DAT_004bf668);
  auStack_230._0_8_ = 0x20a6db;
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_18,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a6ea;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a70a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[9],_true>(&local_90,(char (*) [9])"BLUR_RGB",&local_200);
  auStack_230._0_8_ = 0x20a71c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a72c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a742;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a74c;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a756;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a76e;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a778;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a782;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a78c;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  local_1e0._0_4_ = TRANSFORMATION_GIZMO_ROT_VERT;
  auStack_230._0_8_ = 0x20a7b3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_1e0 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bfee8);
  auStack_230._0_8_ = 0x20a7c5;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)local_1c0,
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bff00);
  auStack_230._0_8_ = 0x20a7da;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)local_1a8,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bff18);
  local_190._M_p =
       (pointer)&local_188.
                 super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
  auStack_230._0_8_ = 0x20a7ff;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,DAT_004bff30,DAT_004bff38 + DAT_004bff30);
  local_170._0_4_ = TRANSFORMATION_GIZMO_ROT_FRAG;
  auStack_230._0_8_ = 0x20a823;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)(local_170 + 8),
           (vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
            *)&DAT_004bff58);
  auStack_230._0_8_ = 0x20a838;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)(local_158 + 8),
           (vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
            *)&DAT_004bff70);
  auStack_230._0_8_ = 0x20a84d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::vector(&local_138,
           (vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
            *)&DAT_004bff88);
  local_120[0] = local_110;
  auStack_230._0_8_ = 0x20a872;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,DAT_004bffa0,DAT_004bffa8 + DAT_004bffa0);
  auStack_230._0_8_ = 0x20a88b;
  __l_19._M_len = 2;
  __l_19._M_array = (iterator)local_1e0;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218,__l_19,(allocator_type *)(auStack_230 + 0xf));
  auStack_230._0_8_ = 0x20a89a;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::vector(&local_200.first,
           (vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
            *)&local_218);
  local_200.second = Triangles;
  auStack_230._0_8_ = 0x20a8ba;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>,_polyscope::DrawMode>_>
  ::pair<const_char_(&)[25],_true>(&local_90,(char (*) [25])"TRANSFORMATION_GIZMO_ROT",&local_200);
  auStack_230._0_8_ = 0x20a8cc;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_emplace<std::pair<std::__cxx11::string_const,std::pair<std::vector<polyscope::render::ShaderStageSpecification,std::allocator<polyscope::render::ShaderStageSpecification>>,polyscope::DrawMode>>>
            (local_220,&local_90);
  auStack_230._0_8_ = 0x20a8dc;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_90.second.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.first._M_dataplus._M_p != &local_90.first.field_2) {
    auStack_230._0_8_ = 0x20a8f2;
    operator_delete(local_90.first._M_dataplus._M_p);
  }
  auStack_230._0_8_ = 0x20a8fc;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector(&local_200.first);
  auStack_230._0_8_ = 0x20a906;
  std::
  vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
  ::~vector((vector<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
             *)&local_218);
  lVar4 = 0xe0;
  do {
    puVar2 = *(undefined1 **)
              ((long)&local_200.first.
                      super__Vector_base<polyscope::render::ShaderStageSpecification,_std::allocator<polyscope::render::ShaderStageSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar4);
    if (local_1e0 + lVar4 + -0x10 != puVar2) {
      auStack_230._0_8_ = 0x20a91e;
      operator_delete(puVar2);
    }
    auStack_230._0_8_ = 0x20a928;
    std::
    vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
    ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
               *)((long)&local_218.
                         super__Vector_base<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    auStack_230._0_8_ = 0x20a932;
    std::
    vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
    ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
               *)(auStack_230 + lVar4));
    auStack_230._0_8_ = 0x20a93c;
    std::
    vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
    ::~vector((vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
               *)((long)&vStack_248.
                         super__Vector_base<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x70;
  } while (lVar4 != 0);
  puVar5 = &pGVar3->registeredShaderRules;
  auStack_230._0_8_ = 0x20a964;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [13])"GLSL_VERSION",(ShaderReplacementRule *)GLSL_VERSION);
  auStack_230._0_8_ = 0x20a96f;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20a97c;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20a989;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20a996;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20a9a6;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  pSVar1 = (pointer)(local_1c0 + 0x10);
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20a9b9;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20a9cc;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20a9e7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"GLOBAL_FRAGMENT_FILTER",
             (ShaderReplacementRule *)GLOBAL_FRAGMENT_FILTER);
  auStack_230._0_8_ = 0x20a9f2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20a9ff;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20aa0c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20aa19;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20aa29;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20aa37;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20aa46;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20aa61;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_1",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_1);
  auStack_230._0_8_ = 0x20aa6c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20aa79;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20aa86;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20aa93;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20aaa3;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20aab1;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20aac0;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20aadb;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_2",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_2);
  auStack_230._0_8_ = 0x20aae6;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20aaf3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ab00;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ab0d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ab1d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ab2b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ab3a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ab55;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_3",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_3);
  auStack_230._0_8_ = 0x20ab60;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ab6d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ab7a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ab87;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ab97;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20aba5;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20abb4;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20abcf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"DOWNSAMPLE_RESOLVE_4",
             (ShaderReplacementRule *)DOWNSAMPLE_RESOLVE_4);
  auStack_230._0_8_ = 0x20abda;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20abe7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20abf4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ac01;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ac11;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ac1f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ac2e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ac49;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"TRANSPARENCY_STRUCTURE",
             (ShaderReplacementRule *)TRANSPARENCY_STRUCTURE);
  auStack_230._0_8_ = 0x20ac54;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ac61;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ac6e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ac7b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ac8b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ac99;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20aca8;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20acc3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [28])"TRANSPARENCY_RESOLVE_SIMPLE",
             (ShaderReplacementRule *)TRANSPARENCY_RESOLVE_SIMPLE);
  auStack_230._0_8_ = 0x20acce;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20acdb;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ace8;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20acf5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ad05;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ad13;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ad22;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ad3d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[28],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [28])"TRANSPARENCY_PEEL_STRUCTURE",
             (ShaderReplacementRule *)TRANSPARENCY_PEEL_STRUCTURE);
  auStack_230._0_8_ = 0x20ad48;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ad55;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ad62;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ad6f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ad7f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ad8d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ad9c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20adb7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"TRANSPARENCY_PEEL_GROUND",
             (ShaderReplacementRule *)TRANSPARENCY_PEEL_GROUND);
  auStack_230._0_8_ = 0x20adc2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20adcf;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20addc;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ade9;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20adf9;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ae07;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ae16;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ae31;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [19])"GENERATE_WORLD_POS",
             (ShaderReplacementRule *)GENERATE_WORLD_POS);
  auStack_230._0_8_ = 0x20ae3c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ae49;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ae56;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ae63;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ae73;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ae81;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ae90;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20aeab;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"CULL_POS_FROM_WORLD",
             (ShaderReplacementRule *)CULL_POS_FROM_WORLD);
  auStack_230._0_8_ = 0x20aeb6;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20aec3;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20aed0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20aedd;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20aeed;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20aefb;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20af0a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20af25;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[19],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [19])"CULL_POS_FROM_ATTR",
             (ShaderReplacementRule *)CULL_POS_FROM_ATTR);
  auStack_230._0_8_ = 0x20af30;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20af3d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20af4a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20af57;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20af67;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20af75;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20af84;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20af9f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[13],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [13])"LIGHT_MATCAP",(ShaderReplacementRule *)LIGHT_MATCAP);
  auStack_230._0_8_ = 0x20afaa;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20afb7;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20afc4;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20afd1;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20afe1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20afef;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20affe;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b019;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [15])"LIGHT_PASSTHRU",(ShaderReplacementRule *)LIGHT_PASSTHRU);
  auStack_230._0_8_ = 0x20b024;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b031;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b03e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b04b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b05b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b069;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b078;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b093;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[16],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [16])"SHADE_BASECOLOR",(ShaderReplacementRule *)SHADE_BASECOLOR)
  ;
  auStack_230._0_8_ = 0x20b09e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b0ab;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b0b8;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b0c5;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b0d5;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b0e3;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b0f2;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b10d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[12],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [12])0x420233,(ShaderReplacementRule *)SHADE_COLOR);
  auStack_230._0_8_ = 0x20b118;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b125;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b132;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b13f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b14f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b15d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b16c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b187;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SHADE_COLORMAP_VALUE",
             (ShaderReplacementRule *)SHADE_COLORMAP_VALUE);
  auStack_230._0_8_ = 0x20b192;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b19f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b1ac;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b1b9;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b1c9;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b1d7;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b1e6;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b201;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"SHADE_COLORMAP_ANGULAR2",
             (ShaderReplacementRule *)SHADE_COLORMAP_ANGULAR2);
  auStack_230._0_8_ = 0x20b20c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b219;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b226;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b233;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b243;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b251;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b260;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b27b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[18],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [18])"SHADE_GRID_VALUE2",
             (ShaderReplacementRule *)SHADE_GRID_VALUE2);
  auStack_230._0_8_ = 0x20b286;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b293;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b2a0;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b2ad;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b2bd;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b2cb;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b2da;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b2f5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SHADE_CHECKER_VALUE2",
             (ShaderReplacementRule *)SHADE_CHECKER_VALUE2);
  auStack_230._0_8_ = 0x20b300;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b30d;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b31a;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b327;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b337;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b345;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b354;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b36f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [22])"SHADEVALUE_MAG_VALUE2",
             (ShaderReplacementRule *)SHADEVALUE_MAG_VALUE2);
  auStack_230._0_8_ = 0x20b37a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b387;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b394;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b3a1;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b3b1;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b3bf;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b3ce;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b3e9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [26])"ISOLINE_STRIPE_VALUECOLOR",
             (ShaderReplacementRule *)ISOLINE_STRIPE_VALUECOLOR);
  auStack_230._0_8_ = 0x20b3f4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b401;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b40e;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b41b;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b42b;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b439;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b448;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b463;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"CHECKER_VALUE2COLOR",
             (ShaderReplacementRule *)CHECKER_VALUE2COLOR);
  auStack_230._0_8_ = 0x20b46e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b47b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b488;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b495;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b4a5;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b4b3;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b4c2;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b4dd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [15])"MESH_WIREFRAME",(ShaderReplacementRule *)MESH_WIREFRAME);
  auStack_230._0_8_ = 0x20b4e8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b4f5;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b502;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b50f;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b51f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b52d;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b53c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b557;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[26],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [26])"MESH_BACKFACE_NORMAL_FLIP",
             (ShaderReplacementRule *)MESH_BACKFACE_NORMAL_FLIP);
  auStack_230._0_8_ = 0x20b562;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b56f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b57c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b589;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b599;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b5a7;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b5b6;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b5d1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_BACKFACE_DARKEN",
             (ShaderReplacementRule *)MESH_BACKFACE_DARKEN);
  auStack_230._0_8_ = 0x20b5dc;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b5e9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b5f6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b603;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b613;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b621;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b630;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b64b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_PROPAGATE_VALUE",
             (ShaderReplacementRule *)MESH_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20b656;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b663;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b670;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b67d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b68d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b69b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b6aa;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b6c5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[22],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [22])"MESH_PROPAGATE_VALUE2",
             (ShaderReplacementRule *)MESH_PROPAGATE_VALUE2);
  auStack_230._0_8_ = 0x20b6d0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b6dd;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b6ea;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b6f7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b707;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b715;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b724;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b73f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"MESH_PROPAGATE_COLOR",
             (ShaderReplacementRule *)MESH_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20b74a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b757;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b764;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b771;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b781;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b78f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b79e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b7b9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[30],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [30])"MESH_PROPAGATE_HALFEDGE_VALUE",
             (ShaderReplacementRule *)MESH_PROPAGATE_HALFEDGE_VALUE);
  auStack_230._0_8_ = 0x20b7c4;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b7d1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b7de;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b7eb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b7fb;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b809;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b818;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b833;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [20])"MESH_PROPAGATE_PICK",
             (ShaderReplacementRule *)MESH_PROPAGATE_PICK);
  auStack_230._0_8_ = 0x20b83e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b84b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b858;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b865;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b875;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b883;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b892;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b8ad;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"SPHERE_PROPAGATE_VALUE",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20b8b8;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b8c5;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b8d2;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b8df;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b8ef;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b8fd;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b90c;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b927;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"SPHERE_PROPAGATE_VALUE2",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_VALUE2);
  auStack_230._0_8_ = 0x20b932;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b93f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b94c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b959;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b969;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b977;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20b986;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20b9a1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"SPHERE_PROPAGATE_COLOR",
             (ShaderReplacementRule *)SPHERE_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20b9ac;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20b9b9;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20b9c6;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20b9d3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20b9e3;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20b9f1;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ba00;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ba1b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[21],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [21])"SPHERE_VARIABLE_SIZE",
             (ShaderReplacementRule *)SPHERE_VARIABLE_SIZE);
  auStack_230._0_8_ = 0x20ba26;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20ba33;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20ba40;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20ba4d;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20ba5d;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20ba6b;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20ba7a;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20ba95;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[23],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [23])"VECTOR_PROPAGATE_COLOR",
             (ShaderReplacementRule *)VECTOR_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20baa0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20baad;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20baba;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bac7;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bad7;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bae5;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20baf4;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bb0f;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"TRANSFORMATION_GIZMO_VEC",
             (ShaderReplacementRule *)TRANSFORMATION_GIZMO_VEC);
  auStack_230._0_8_ = 0x20bb1a;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bb27;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bb34;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bb41;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bb51;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bb5f;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bb6e;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bb89;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"CYLINDER_PROPAGATE_VALUE",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_VALUE);
  auStack_230._0_8_ = 0x20bb94;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bba1;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bbae;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bbbb;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bbcb;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bbd9;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bbe8;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bc03;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [31])"CYLINDER_PROPAGATE_BLEND_VALUE",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_BLEND_VALUE);
  auStack_230._0_8_ = 0x20bc0e;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bc1b;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bc28;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bc35;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bc45;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bc53;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bc62;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bc7d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[25],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [25])"CYLINDER_PROPAGATE_COLOR",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_COLOR);
  auStack_230._0_8_ = 0x20bc88;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bc95;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bca2;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bcaf;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bcbf;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bccd;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bcdc;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bcf7;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[31],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [31])"CYLINDER_PROPAGATE_BLEND_COLOR",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_BLEND_COLOR);
  auStack_230._0_8_ = 0x20bd02;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bd0f;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bd1c;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bd29;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bd39;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bd47;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bd56;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  auStack_230._0_8_ = 0x20bd71;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
  ::pair<const_char_(&)[24],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0,(char (*) [24])"CYLINDER_PROPAGATE_PICK",
             (ShaderReplacementRule *)CYLINDER_PROPAGATE_PICK);
  auStack_230._0_8_ = 0x20bd7c;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>,std::allocator<std::pair<std::__cxx11::string_const,polyscope::render::ShaderReplacementRule>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)puVar5,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_polyscope::render::ShaderReplacementRule>
              *)local_1e0);
  auStack_230._0_8_ = 0x20bd89;
  std::
  vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
  ::~vector((vector<polyscope::render::ShaderSpecTexture,_std::allocator<polyscope::render::ShaderSpecTexture>_>
             *)local_158);
  auStack_230._0_8_ = 0x20bd96;
  std::
  vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
  ::~vector((vector<polyscope::render::ShaderSpecAttribute,_std::allocator<polyscope::render::ShaderSpecAttribute>_>
             *)local_170);
  auStack_230._0_8_ = 0x20bda3;
  std::
  vector<polyscope::render::ShaderSpecUniform,_std::allocator<polyscope::render::ShaderSpecUniform>_>
  ::~vector(&local_188);
  auStack_230._0_8_ = 0x20bdb3;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1a8 + 8));
  if ((pointer)local_1c0._0_8_ != pSVar1) {
    auStack_230._0_8_ = 0x20bdc1;
    operator_delete((void *)local_1c0._0_8_);
  }
  if ((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_) != local_1d0) {
    auStack_230._0_8_ = 0x20bdd0;
    operator_delete((undefined1 *)CONCAT44(local_1e0._4_4_,local_1e0._0_4_));
  }
  return;
}

Assistant:

void GLEngine::populateDefaultShadersAndRules() {
  // Note: we use .insert({key, value}) rather than map[key] = value to support const members in the value.

  // clang-format off

  // == Load general base shaders
  registeredShaderPrograms.insert({"MESH", {{FLEX_MESH_VERT_SHADER, FLEX_MESH_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RAYCAST_SPHERE", {{FLEX_SPHERE_VERT_SHADER, FLEX_SPHERE_GEOM_SHADER, FLEX_SPHERE_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_VECTOR", {{FLEX_VECTOR_VERT_SHADER, FLEX_VECTOR_GEOM_SHADER, FLEX_VECTOR_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"RAYCAST_CYLINDER", {{FLEX_CYLINDER_VERT_SHADER, FLEX_CYLINDER_GEOM_SHADER, FLEX_CYLINDER_FRAG_SHADER}, DrawMode::Points}});
  registeredShaderPrograms.insert({"HISTOGRAM", {{HISTOGRAM_VERT_SHADER, HISTOGRAM_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_TILE_REFLECT", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_TILE_REFLECT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"GROUND_PLANE_SHADOW", {{GROUND_PLANE_VERT_SHADER, GROUND_PLANE_SHADOW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"MAP_LIGHT", {{TEXTURE_DRAW_VERT_SHADER, MAP_LIGHT_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"RIBBON", {{RIBBON_VERT_SHADER, RIBBON_GEOM_SHADER, RIBBON_FRAG_SHADER}, DrawMode::IndexedLineStripAdjacency}});
  registeredShaderPrograms.insert({"SLICE_PLANE", {{SLICE_PLANE_VERT_SHADER, SLICE_PLANE_FRAG_SHADER}, DrawMode::Triangles}});

  registeredShaderPrograms.insert({"TEXTURE_DRAW_PLAIN", {{TEXTURE_DRAW_VERT_SHADER, PLAIN_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_DOT3", {{TEXTURE_DRAW_VERT_SHADER, DOT3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_MAP3", {{TEXTURE_DRAW_VERT_SHADER, MAP3_TEXTURE_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TEXTURE_DRAW_SPHEREBG", {{SPHEREBG_DRAW_VERT_SHADER, SPHEREBG_DRAW_FRAG_SHADER}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"COMPOSITE_PEEL", {{TEXTURE_DRAW_VERT_SHADER, COMPOSITE_PEEL}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_COPY", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_COPY}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"DEPTH_TO_MASK", {{TEXTURE_DRAW_VERT_SHADER, DEPTH_TO_MASK}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"SCALAR_TEXTURE_COLORMAP", {{TEXTURE_DRAW_VERT_SHADER, SCALAR_TEXTURE_COLORMAP}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"BLUR_RGB", {{TEXTURE_DRAW_VERT_SHADER, BLUR_RGB}, DrawMode::Triangles}});
  registeredShaderPrograms.insert({"TRANSFORMATION_GIZMO_ROT", {{TRANSFORMATION_GIZMO_ROT_VERT, TRANSFORMATION_GIZMO_ROT_FRAG}, DrawMode::Triangles}});

  // === Load rules

  // Utility rules
  registeredShaderRules.insert({"GLSL_VERSION", GLSL_VERSION});
  registeredShaderRules.insert({"GLOBAL_FRAGMENT_FILTER", GLOBAL_FRAGMENT_FILTER});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_1", DOWNSAMPLE_RESOLVE_1});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_2", DOWNSAMPLE_RESOLVE_2});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_3", DOWNSAMPLE_RESOLVE_3});
  registeredShaderRules.insert({"DOWNSAMPLE_RESOLVE_4", DOWNSAMPLE_RESOLVE_4});
  
  registeredShaderRules.insert({"TRANSPARENCY_STRUCTURE", TRANSPARENCY_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_RESOLVE_SIMPLE", TRANSPARENCY_RESOLVE_SIMPLE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_STRUCTURE", TRANSPARENCY_PEEL_STRUCTURE});
  registeredShaderRules.insert({"TRANSPARENCY_PEEL_GROUND", TRANSPARENCY_PEEL_GROUND});
  
  registeredShaderRules.insert({"GENERATE_WORLD_POS", GENERATE_WORLD_POS});
  registeredShaderRules.insert({"CULL_POS_FROM_WORLD", CULL_POS_FROM_WORLD});
  registeredShaderRules.insert({"CULL_POS_FROM_ATTR", CULL_POS_FROM_ATTR});

  // Lighting and shading things
  registeredShaderRules.insert({"LIGHT_MATCAP", LIGHT_MATCAP});
  registeredShaderRules.insert({"LIGHT_PASSTHRU", LIGHT_PASSTHRU});
  registeredShaderRules.insert({"SHADE_BASECOLOR", SHADE_BASECOLOR});
  registeredShaderRules.insert({"SHADE_COLOR", SHADE_COLOR});
  registeredShaderRules.insert({"SHADE_COLORMAP_VALUE", SHADE_COLORMAP_VALUE});
  registeredShaderRules.insert({"SHADE_COLORMAP_ANGULAR2", SHADE_COLORMAP_ANGULAR2});
  registeredShaderRules.insert({"SHADE_GRID_VALUE2", SHADE_GRID_VALUE2});
  registeredShaderRules.insert({"SHADE_CHECKER_VALUE2", SHADE_CHECKER_VALUE2});
  registeredShaderRules.insert({"SHADEVALUE_MAG_VALUE2", SHADEVALUE_MAG_VALUE2});
  registeredShaderRules.insert({"ISOLINE_STRIPE_VALUECOLOR", ISOLINE_STRIPE_VALUECOLOR});
  registeredShaderRules.insert({"CHECKER_VALUE2COLOR", CHECKER_VALUE2COLOR});

  // mesh things
  registeredShaderRules.insert({"MESH_WIREFRAME", MESH_WIREFRAME});
  registeredShaderRules.insert({"MESH_BACKFACE_NORMAL_FLIP", MESH_BACKFACE_NORMAL_FLIP});
  registeredShaderRules.insert({"MESH_BACKFACE_DARKEN", MESH_BACKFACE_DARKEN});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE", MESH_PROPAGATE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_VALUE2", MESH_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"MESH_PROPAGATE_COLOR", MESH_PROPAGATE_COLOR});
  registeredShaderRules.insert({"MESH_PROPAGATE_HALFEDGE_VALUE", MESH_PROPAGATE_HALFEDGE_VALUE});
  registeredShaderRules.insert({"MESH_PROPAGATE_PICK", MESH_PROPAGATE_PICK});

  // sphere things
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE", SPHERE_PROPAGATE_VALUE});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_VALUE2", SPHERE_PROPAGATE_VALUE2});
  registeredShaderRules.insert({"SPHERE_PROPAGATE_COLOR", SPHERE_PROPAGATE_COLOR});
  registeredShaderRules.insert({"SPHERE_VARIABLE_SIZE", SPHERE_VARIABLE_SIZE});

  // vector things
  registeredShaderRules.insert({"VECTOR_PROPAGATE_COLOR", VECTOR_PROPAGATE_COLOR});
  registeredShaderRules.insert({"TRANSFORMATION_GIZMO_VEC", TRANSFORMATION_GIZMO_VEC});

  // cylinder things
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_VALUE", CYLINDER_PROPAGATE_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_VALUE", CYLINDER_PROPAGATE_BLEND_VALUE});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_COLOR", CYLINDER_PROPAGATE_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_BLEND_COLOR", CYLINDER_PROPAGATE_BLEND_COLOR});
  registeredShaderRules.insert({"CYLINDER_PROPAGATE_PICK", CYLINDER_PROPAGATE_PICK});

  // clang-format on
}